

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

bool __thiscall
t_swift_generator::struct_has_optional_fields(t_swift_generator *this,t_struct *tstruct)

{
  pointer pptVar1;
  pointer pptVar2;
  bool bVar3;
  pointer pptVar4;
  
  pptVar2 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    pptVar4 = pptVar2;
    pptVar1 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pptVar4 == pptVar1) break;
    bVar3 = field_is_optional(this,*pptVar4);
    pptVar2 = pptVar4 + 1;
  } while (!bVar3);
  return pptVar4 != pptVar1;
}

Assistant:

bool struct_has_optional_fields(t_struct* tstruct) {
    const vector<t_field*>& members = tstruct->get_members();
    vector<t_field*>::const_iterator m_iter;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if (field_is_optional(*m_iter)) {
        return true;
      }
    }
    return false;
  }